

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pointer __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
::iterator::operator->(iterator *this)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  reference ppVar4;
  pointer prVar5;
  code *in_RCX;
  code *extraout_RDX;
  SchedulingMode in_ESI;
  bool bVar6;
  
  pcVar3 = (code *)this->ctrl_;
  if (pcVar3 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
    ::iterator::operator->((iterator *)this);
LAB_0022a02f:
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
    ::iterator::operator->((iterator *)this);
  }
  else {
    in_RCX = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
    if (pcVar3 == absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>)
    goto LAB_0022a02f;
    if (-1 < (char)*pcVar3) {
      ppVar4 = operator*(this);
      return ppVar4;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
  ::iterator::operator->((iterator *)this);
  iVar2 = *(int *)&this->ctrl_;
  if (iVar2 < 0x5a308d2) {
    if ((iVar2 != 0) && (iVar2 != 0xdd)) {
LAB_0022a0c8:
      absl::lts_20240722::raw_log_internal::RawLog
                (kFatal,"call_once.h",0xa2,"Unexpected value for control word: 0x%lx");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/base/call_once.h"
                    ,0xa2,
                    "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = void (&)(const google::protobuf::FieldDescriptor *), Args = <const google::protobuf::FieldDescriptor *>]"
                   );
    }
  }
  else if ((iVar2 != 0x5a308d2) && (iVar2 != 0x65c2937b)) goto LAB_0022a0c8;
  LOCK();
  bVar6 = *(int *)&this->ctrl_ == 0;
  if (bVar6) {
    *(undefined4 *)&this->ctrl_ = 0x65c2937b;
  }
  UNLOCK();
  if ((bVar6) ||
     (prVar5 = (pointer)absl::lts_20240722::base_internal::SpinLockWait
                                  ((atomic *)this,3,
                                   base_internal::
                                   CallOnceImpl<void_(&)(const_google::protobuf::FieldDescriptor_*),_const_google::protobuf::FieldDescriptor_*>
                                   ::trans,in_ESI), (int)prVar5 == 0)) {
    (*extraout_RDX)(*(undefined8 *)in_RCX);
    LOCK();
    uVar1 = *(uint *)&this->ctrl_;
    *(undefined4 *)&this->ctrl_ = 0xdd;
    prVar5 = (pointer)(ulong)uVar1;
    UNLOCK();
    if (uVar1 == 0x5a308d2) {
      prVar5 = (pointer)AbslInternalSpinLockWake_lts_20240722(this,1);
      return prVar5;
    }
  }
  return prVar5;
}

Assistant:

pointer operator->() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator->");
      return &operator*();
    }